

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

void __thiscall
timertt::details::
thread_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::join(thread_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
       *this)

{
  bool bVar1;
  undefined1 local_50 [8];
  lock_guard locker_1;
  undefined1 local_30 [8];
  lock_guard locker;
  shared_ptr<std::thread> t;
  thread_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  
  std::shared_ptr<std::thread>::shared_ptr((shared_ptr<std::thread> *)&locker.m_lock._M_owns);
  thread_mixin::lock_guard::lock_guard((lock_guard *)local_30,(thread_mixin *)this);
  std::shared_ptr<std::thread>::operator=
            ((shared_ptr<std::thread> *)&locker.m_lock._M_owns,
             &(this->
              super_basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
              ).super_type.m_thread);
  thread_mixin::lock_guard::~lock_guard((lock_guard *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&locker.m_lock._M_owns);
  if (bVar1) {
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &locker.m_lock._M_owns);
    std::thread::join();
    thread_mixin::lock_guard::lock_guard((lock_guard *)local_50,(thread_mixin *)this);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->
                super_basic_methods_impl_mixin<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::thread>
                ).super_type.m_thread.super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>);
    thread_mixin::lock_guard::~lock_guard((lock_guard *)local_50);
  }
  std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)&locker.m_lock._M_owns);
  return;
}

Assistant:

void
	join()
	{
		std::shared_ptr< std::thread > t;
		{
			typename base_type::lock_guard locker{ *this };
			t = this->m_thread;
		}
		if( t )
		{
			t->join();

			typename base_type::lock_guard locker{ *this };
			this->m_thread.reset();
		}
	}